

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::CodeGeneratorResponse
          (CodeGeneratorResponse *this,CodeGeneratorResponse *from)

{
  CodeGeneratorResponse *from_local;
  CodeGeneratorResponse *this_local;
  
  Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__CodeGeneratorResponse_0040ed48;
  UnknownFieldSet::UnknownFieldSet(&this->_unknown_fields_);
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::RepeatedPtrField
            (&this->file_);
  SharedCtor(this);
  MergeFrom(this,from);
  return;
}

Assistant:

CodeGeneratorResponse::CodeGeneratorResponse(const CodeGeneratorResponse& from)
  : ::google::protobuf::Message() {
  SharedCtor();
  MergeFrom(from);
}